

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O0

uint8_t * chunkmemset_avx2(uint8_t *out,uint8_t *from,uint len)

{
  uint uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint in_EDX;
  byte *in_RSI;
  halfchunk_t *chunk;
  uint8_t *in_RDI;
  halfchunk_t halfchunk_load;
  uint64_t dist;
  int64_t sdist;
  uint32_t adv_amount;
  uint32_t chunk_mod;
  chunk_t_conflict1 chunk_load;
  uint8_t *in_stack_00000060;
  chunk_t_conflict1 *in_stack_ffffffffffffff40;
  chunk_t_conflict1 *in_stack_ffffffffffffff48;
  uint8_t *in_stack_ffffffffffffff50;
  longlong in_stack_ffffffffffffff58;
  uint8_t *in_stack_ffffffffffffff60;
  int local_84;
  longlong local_80 [2];
  longlong in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  uint8_t *in_stack_ffffffffffffffa0;
  uint local_4c;
  uint8_t *local_40;
  
  local_84 = 0;
  puVar2 = in_RDI + -(long)in_RSI;
  puVar3 = puVar2;
  if ((long)puVar2 < 1) {
    puVar3 = (uint8_t *)-(long)puVar2;
  }
  if (((long)puVar2 < 0) && (puVar3 < (uint8_t *)(ulong)in_EDX)) {
    memmove(in_RDI,in_RSI,(ulong)in_EDX);
    return in_RDI + in_EDX;
  }
  if (puVar3 == (uint8_t *)0x1) {
    memset(in_RDI,(uint)*in_RSI,(ulong)in_EDX);
    return in_RDI + in_EDX;
  }
  if ((uint8_t *)0x1f < puVar3) {
    puVar3 = chunkcopy_avx2(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                            (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    return puVar3;
  }
  local_4c = in_EDX;
  local_40 = in_RDI;
  if (in_EDX < 0x11) {
    if ((uint8_t *)0xf < puVar3) {
      puVar3 = HALFCHUNKCOPY(puVar3,in_stack_ffffffffffffff60,
                             (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      return puVar3;
    }
    if ((((ulong)puVar3 & 1) != 0) || (puVar3 == (uint8_t *)0x6)) {
      chunk = (halfchunk_t *)&local_84;
      GET_HALFCHUNK_MAG(in_RSI,(uint32_t *)chunk,(uint32_t)puVar3);
      if (in_EDX == 0x10) {
        chunk = (halfchunk_t *)&stack0xffffffffffffff50;
        storehalfchunk(in_RDI,chunk);
        local_4c = 0;
        local_40 = in_RDI + 0x10;
      }
      halfchunk2whole((chunk_t_conflict1 *)&stack0xffffffffffffff50,chunk);
      goto LAB_00130542;
    }
  }
  if (puVar3 == (uint8_t *)0x2) {
    chunkmemset_2((uint8_t *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  else if (puVar3 == (uint8_t *)0x4) {
    chunkmemset_4((uint8_t *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  else if (puVar3 == (uint8_t *)0x8) {
    chunkmemset_8((uint8_t *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  else if (puVar3 == (uint8_t *)0x10) {
    chunkmemset_16(in_RSI,(chunk_t_conflict1 *)local_80);
  }
  else {
    GET_CHUNK_MAG(in_stack_00000060,(uint32_t *)chunk_load[3],chunk_load[2]._4_4_);
  }
  uVar1 = 0x20 - local_84;
  for (; 0x3f < local_4c; local_4c = local_4c + uVar1 * -2) {
    storechunk(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    storechunk(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_40 = local_40 + uVar1 * 2;
  }
  for (; 0x1f < local_4c; local_4c = local_4c - uVar1) {
    storechunk(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_40 = local_40 + uVar1;
  }
LAB_00130542:
  if (local_4c != 0) {
    memcpy(local_40,local_80,(ulong)local_4c);
    local_40 = local_40 + local_4c;
  }
  return local_40;
}

Assistant:

static inline uint8_t* CHUNKMEMSET(uint8_t *out, uint8_t *from, unsigned len) {
    /* Debug performance related issues when len < sizeof(uint64_t):
       Assert(len >= sizeof(uint64_t), "chunkmemset should be called on larger chunks"); */
    Assert(from != out, "chunkmemset cannot have a distance 0");

    chunk_t chunk_load;
    uint32_t chunk_mod = 0;
    uint32_t adv_amount;
    int64_t sdist = out - from;
    uint64_t dist = llabs(sdist);

    /* We are supporting the case for when we are reading bytes from ahead in the buffer.
     * We now have to handle this, though it wasn't _quite_ clear if this rare circumstance
     * always needed to be handled here or if we're just now seeing it because we are
     * dispatching to this function, more */
    if (sdist < 0 && dist < len) {
#ifdef HAVE_MASKED_READWRITE
        /* We can still handle this case if we can mitigate over writing _and_ we
         * fit the entirety of the copy length with one load */
        if (len <= sizeof(chunk_t)) {
            /* Tempting to add a goto to the block below but hopefully most compilers
             * collapse these identical code segments as one label to jump to */
            return CHUNKCOPY(out, from, len);
        }
#endif
        /* Here the memmove semantics match perfectly, as when this happens we are
         * effectively sliding down the contents of memory by dist bytes */
        memmove(out, from, len);
        return out + len;
    }

    if (dist == 1) {
        memset(out, *from, len);
        return out + len;
    } else if (dist >= sizeof(chunk_t)) {
        return CHUNKCOPY(out, from, len);
    }

    /* Only AVX2+ as there's 128 bit vectors and 256 bit. We allow for shorter vector
     * lengths because they serve to allow more cases to fall into chunkcopy, as the
     * distance of the shorter length is still deemed a safe distance. We rewrite this
     * here rather than calling the ssse3 variant directly now because doing so required
     * dispatching to another function and broke inlining for this function entirely. We
     * also can merge an assert and some remainder peeling behavior into the same code blocks,
     * making the code a little smaller.  */
#ifdef HAVE_HALF_CHUNK
    if (len <= sizeof(halfchunk_t)) {
        if (dist >= sizeof(halfchunk_t))
            return HALFCHUNKCOPY(out, from, len);

        if ((dist % 2) != 0 || dist == 6) {
            halfchunk_t halfchunk_load = GET_HALFCHUNK_MAG(from, &chunk_mod, (unsigned)dist);

            if (len == sizeof(halfchunk_t)) {
                storehalfchunk(out, &halfchunk_load);
                len -= sizeof(halfchunk_t);
                out += sizeof(halfchunk_t);
            }

            chunk_load = halfchunk2whole(&halfchunk_load);
            goto rem_bytes;
        }
    }
#endif

#ifdef HAVE_CHUNKMEMSET_2
    if (dist == 2) {
        chunkmemset_2(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_4
    if (dist == 4) {
        chunkmemset_4(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_8
    if (dist == 8) {
        chunkmemset_8(from, &chunk_load);
    } else
#endif
#ifdef HAVE_CHUNKMEMSET_16
    if (dist == 16) {
        chunkmemset_16(from, &chunk_load);
    } else
#endif
    chunk_load = GET_CHUNK_MAG(from, &chunk_mod, (unsigned)dist);

    adv_amount = sizeof(chunk_t) - chunk_mod;

    while (len >= (2 * sizeof(chunk_t))) {
        storechunk(out, &chunk_load);
        storechunk(out + adv_amount, &chunk_load);
        out += 2 * adv_amount;
        len -= 2 * adv_amount;
    }

    /* If we don't have a "dist" length that divides evenly into a vector
     * register, we can write the whole vector register but we need only
     * advance by the amount of the whole string that fits in our chunk_t.
     * If we do divide evenly into the vector length, adv_amount = chunk_t size*/
    while (len >= sizeof(chunk_t)) {
        storechunk(out, &chunk_load);
        len -= adv_amount;
        out += adv_amount;
    }

#ifdef HAVE_HALF_CHUNK
rem_bytes:
#endif
    if (len) {
        memcpy(out, &chunk_load, len);
        out += len;
    }

    return out;
}